

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

ostream * operator<<(ostream *out,nodekind *n)

{
  code *pcVar1;
  nodekind *n_local;
  ostream *out_local;
  
  switch(*n) {
  case PROG:
    out_local = std::operator<<(out,"Program");
    break;
  case FUNC:
    out_local = std::operator<<(out,"Function");
    break;
  case RETURN:
    out_local = std::operator<<(out,"Return");
    break;
  case FOR:
    out_local = std::operator<<(out,"For");
    break;
  case IF:
    out_local = std::operator<<(out,"If");
    break;
  case WHILE:
    out_local = std::operator<<(out,"While");
    break;
  case CONST:
    out_local = std::operator<<(out,"Const");
    break;
  case EXPRESSION:
    out_local = std::operator<<(out,"Expression");
    break;
  case VAR:
    out_local = std::operator<<(out,"Var");
    break;
  case SET:
    out_local = std::operator<<(out,"Set");
    break;
  case COMPL:
    out_local = std::operator<<(out,"Comp op: \"<\"");
    break;
  case COMPR:
    out_local = std::operator<<(out,"Comp op: \">\"");
    break;
  case ADD:
    out_local = std::operator<<(out,"Add");
    break;
  case SUB:
    out_local = std::operator<<(out,"Sub");
    break;
  case MUL:
    out_local = std::operator<<(out,"Multiplication");
    break;
  case DIV:
    out_local = std::operator<<(out,"Division");
    break;
  case EMPTY:
    out_local = std::operator<<(out,"Empty");
    break;
  case SEQ:
    out_local = std::operator<<(out,"Statement");
    break;
  case UN_OP_EXPR_N:
    out_local = std::operator<<(out,"Negation: op: \"-\"");
    break;
  case UN_OP_EXPR_L_N:
    out_local = std::operator<<(out,"Negation: op: \"!\"");
    break;
  case ELSE:
    out_local = std::operator<<(out,"Else");
    break;
  case INT_DECL:
    out_local = std::operator<<(out,"Int declaration");
    break;
  case DOUBLE_DECL:
    out_local = std::operator<<(out,"Double declaration");
    break;
  case FLOAT_DECL:
    out_local = std::operator<<(out,"Float declaration");
    break;
  case CHAR_DECL:
    out_local = std::operator<<(out,"Char declaration");
    break;
  case ASSIGNMENT:
    out_local = std::operator<<(out,"Assignment");
    break;
  case FUNC_CALL:
    out_local = std::operator<<(out,"Call");
    break;
  default:
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  return out_local;
}

Assistant:

ostream &operator<<(ostream &out, const nodekind &n) {
    switch (n) {
        case PROG:
            return (out << "Program");
        case FUNC:
            return (out << "Function");
        case RETURN:
            return (out << "Return");
        case FOR:
            return (out << "For");
        case IF:
            return (out << "If");
        case WHILE:
            return (out << "While");
        case CONST:
            return (out << "Const");
        case EXPRESSION:
            return (out << "Expression");
        case VAR:
            return (out << "Var");
        case SET:
            return (out << "Set");
        case COMPL:
            return (out << "Comp op: \"<\"");
        case COMPR:
            return (out << "Comp op: \">\"");
        case ADD:
            return (out << "Add");
        case SUB:
            return (out << "Sub");
        case EMPTY:
            return (out << "Empty");
        case SEQ:
            return (out << "Statement");
        case MUL:
            return (out << "Multiplication");
        case DIV:
            return (out << "Division");
        case UN_OP_EXPR_N:
            return (out << "Negation: op: \"-\"");
        case UN_OP_EXPR_L_N:
            return (out << "Negation: op: \"!\"");
        case ELSE:
            return (out << "Else");
        case INT_DECL:
            return (out << "Int declaration");
        case DOUBLE_DECL:
            return (out << "Double declaration");
        case FLOAT_DECL:
            return (out << "Float declaration");
        case CHAR_DECL:
            return (out << "Char declaration");
        case ASSIGNMENT:
            return (out << "Assignment");
        case FUNC_CALL:
            return (out << "Call");
    }
}